

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump2.cpp
# Opt level: O1

void __thiscall DumpParams::resolveLineFormat(DumpParams *this)

{
  uint uVar1;
  int iVar2;
  
  if (this->unitsPerLine != 0) {
    return;
  }
  uVar1 = this->dumpUnitSize - 1;
  if ((uVar1 < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    this->unitsPerLine = *(int *)(&DAT_001055b4 + (ulong)uVar1 * 4);
  }
  if (this->dumpformat == 2) {
    iVar2 = 0x40;
  }
  else {
    if (this->dumpformat != 0) {
      return;
    }
    iVar2 = this->unitsPerLine / 2;
  }
  this->unitsPerLine = iVar2;
  return;
}

Assistant:

void resolveLineFormat()
    {
        if (unitsPerLine==0) {
            switch(dumpUnitSize)
            {
                case 1: unitsPerLine = 32; break;
                case 2: unitsPerLine = 16; break;
                case 4: unitsPerLine = 8; break;
                case 8: unitsPerLine = 4; break;
            }
            switch(dumpformat)
            {
                case DUMP_BOTH:
                    unitsPerLine /= 2;
                    break;
                case DUMP_ASCII:
                    unitsPerLine = 64;
                    break;
            }
        }

    }